

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter.cpp
# Opt level: O0

void __thiscall
QBlittablePlatformPixmap::fromImage
          (QBlittablePlatformPixmap *this,QImage *image,ImageConversionFlags flags)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Format FVar5;
  Format FVar6;
  undefined4 extraout_var;
  qsizetype qVar7;
  size_t __n;
  QImage *in_RSI;
  QBlittablePlatformPixmap *in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  qsizetype bytesCopied;
  uchar *bits;
  uchar *mem;
  QImage *thisImg;
  QImage correctFormatPic;
  QImage *in_stack_ffffffffffffff28;
  uchar *__dest;
  QImage *in_stack_ffffffffffffff30;
  QImage *in_stack_ffffffffffffff38;
  long lVar9;
  undefined4 in_stack_ffffffffffffff40;
  QFlagsStorage<Qt::ImageConversionFlag> flags_00;
  long local_a8;
  QImage *local_a0;
  uchar *local_98;
  undefined1 local_58 [16];
  QImageData *local_48;
  QRectF local_30;
  long local_8;
  QImage *this_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QImage::hasAlphaChannel(in_stack_ffffffffffffff38);
  in_RDI->m_alpha = bVar1;
  qVar8 = QImage::devicePixelRatio(in_RSI);
  in_RDI->m_devicePixelRatio = qVar8;
  uVar2 = QImage::width(in_RSI);
  uVar3 = QImage::height(in_RSI);
  (*(in_RDI->super_QPlatformPixmap)._vptr_QPlatformPixmap[3])(in_RDI,(ulong)uVar2,(ulong)uVar3);
  QRect::QRect((QRect *)in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (int)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (int)in_stack_ffffffffffffff28);
  QRectF::QRectF((QRectF *)CONCAT44(uVar2,in_stack_ffffffffffffff40),
                 (QRect *)in_stack_ffffffffffffff38);
  markRasterOverlay(in_RDI,&local_30);
  iVar4 = (*(in_RDI->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x16])();
  flags_00.i = (Int)((ulong)in_RDI >> 0x20);
  this_00 = (QImage *)CONCAT44(extraout_var,iVar4);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)CONCAT44(uVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  FVar5 = QImage::format((QImage *)local_58);
  FVar6 = QImage::format(this_00);
  if (FVar5 != FVar6) {
    QImage::format(this_00);
    QImage::convertToFormat
              (in_stack_ffffffffffffff38,(Format)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (ImageConversionFlags)flags_00.i);
    QImage::operator=(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    QImage::~QImage(in_stack_ffffffffffffff30);
  }
  local_98 = QImage::bits(in_stack_ffffffffffffff28);
  local_a0 = (QImage *)QImage::constBits((QImage *)local_58);
  local_a8 = 0;
  while( true ) {
    lVar9 = local_a8;
    qVar7 = QImage::sizeInBytes((QImage *)local_58);
    if (qVar7 <= lVar9) break;
    __dest = local_98;
    in_stack_ffffffffffffff30 = local_a0;
    __n = QImage::bytesPerLine((QImage *)local_58);
    memcpy(__dest,in_stack_ffffffffffffff30,__n);
    qVar7 = QImage::bytesPerLine(this_00);
    local_98 = local_98 + qVar7;
    qVar7 = QImage::bytesPerLine((QImage *)local_58);
    local_a0 = (QImage *)((long)&(local_a0->super_QPaintDevice)._vptr_QPaintDevice + qVar7);
    qVar7 = QImage::bytesPerLine((QImage *)local_58);
    local_a8 = qVar7 + local_a8;
  }
  QImage::~QImage(in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlittablePlatformPixmap::fromImage(const QImage &image,
                                     Qt::ImageConversionFlags flags)
{
    m_alpha = image.hasAlphaChannel();
    m_devicePixelRatio = image.devicePixelRatio();
    resize(image.width(),image.height());
    markRasterOverlay(QRect(0,0,w,h));
    QImage *thisImg = buffer();

    QImage correctFormatPic = image;
    if (correctFormatPic.format() != thisImg->format())
        correctFormatPic = correctFormatPic.convertToFormat(thisImg->format(), flags);

    uchar *mem = thisImg->bits();
    const uchar *bits = correctFormatPic.constBits();
    qsizetype bytesCopied = 0;
    while (bytesCopied < correctFormatPic.sizeInBytes()) {
        memcpy(mem,bits,correctFormatPic.bytesPerLine());
        mem += thisImg->bytesPerLine();
        bits += correctFormatPic.bytesPerLine();
        bytesCopied+=correctFormatPic.bytesPerLine();
    }
}